

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitset.c
# Opt level: O0

void bitset_container_offset
               (bitset_container_t *c,container_t **loc,container_t **hic,uint16_t offset)

{
  ushort uVar1;
  sbyte sVar2;
  ushort uVar3;
  ushort uVar4;
  int iVar5;
  int iVar6;
  ushort in_CX;
  undefined8 *in_RDX;
  undefined8 *in_RSI;
  int *in_RDI;
  uint32_t k_1;
  uint32_t k;
  uint16_t end;
  uint16_t i;
  uint16_t b;
  uint64_t val;
  bitset_container_t *bc;
  bitset_container_t *in_stack_ffffffffffffffb8;
  uint local_40;
  uint local_3c;
  bitset_container_t *local_28;
  
  local_28 = (bitset_container_t *)0x0;
  iVar5 = (int)(uint)in_CX >> 6;
  uVar3 = (ushort)iVar5;
  uVar1 = in_CX % 0x40;
  uVar4 = 0x400 - uVar3;
  sVar2 = (sbyte)uVar1;
  if (in_RSI != (undefined8 *)0x0) {
    local_28 = bitset_container_create();
    if (uVar1 == 0) {
      memcpy(local_28->words + iVar5,*(void **)(in_RDI + 2),(long)(int)((uint)uVar4 << 3));
    }
    else {
      local_28->words[uVar3] = **(long **)(in_RDI + 2) << sVar2;
      for (local_3c = 1; local_3c < uVar4; local_3c = local_3c + 1) {
        local_28->words[iVar5 + local_3c] =
             *(ulong *)(*(long *)(in_RDI + 2) + (ulong)(local_3c - 1) * 8) >> (0x40U - sVar2 & 0x3f)
             | *(long *)(*(long *)(in_RDI + 2) + (ulong)local_3c * 8) << sVar2;
      }
    }
    iVar6 = bitset_container_compute_cardinality(in_stack_ffffffffffffffb8);
    local_28->cardinality = iVar6;
    if (local_28->cardinality != 0) {
      *in_RSI = local_28;
    }
    if (local_28->cardinality == *in_RDI) {
      return;
    }
  }
  if (in_RDX == (undefined8 *)0x0) {
    if (local_28->cardinality == 0) {
      bitset_container_free((bitset_container_t *)0x132ce8);
    }
  }
  else {
    if ((local_28 == (bitset_container_t *)0x0) || (local_28->cardinality != 0)) {
      local_28 = bitset_container_create();
    }
    if (uVar1 == 0) {
      memcpy(local_28->words,(void *)(*(long *)(in_RDI + 2) + (long)(int)(uint)uVar4 * 8),
             (long)(iVar5 << 3));
    }
    else {
      for (local_40 = (uint)uVar4; local_40 < 0x400; local_40 = local_40 + 1) {
        local_28->words[local_40 - uVar4] =
             *(ulong *)(*(long *)(in_RDI + 2) + (ulong)(local_40 - 1) * 8) >> (0x40U - sVar2 & 0x3f)
             | *(long *)(*(long *)(in_RDI + 2) + (ulong)local_40 * 8) << sVar2;
      }
      local_28->words[uVar3] = *(ulong *)(*(long *)(in_RDI + 2) + 0x1ff8) >> (0x40U - sVar2 & 0x3f);
    }
    iVar5 = bitset_container_compute_cardinality(in_stack_ffffffffffffffb8);
    local_28->cardinality = iVar5;
    if (local_28->cardinality == 0) {
      bitset_container_free((bitset_container_t *)0x132e3b);
    }
    else {
      *in_RDX = local_28;
    }
  }
  return;
}

Assistant:

void bitset_container_offset(const bitset_container_t *c, container_t **loc,
                             container_t **hic, uint16_t offset) {
    bitset_container_t *bc = NULL;
    uint64_t val;
    uint16_t b, i, end;

    b = offset >> 6;
    i = offset % 64;
    end = 1024 - b;

    if (loc != NULL) {
        bc = bitset_container_create();
        if (i == 0) {
            memcpy(bc->words + b, c->words, 8 * end);
        } else {
            bc->words[b] = c->words[0] << i;
            for (uint32_t k = 1; k < end; ++k) {
                val = c->words[k] << i;
                val |= c->words[k - 1] >> (64 - i);
                bc->words[b + k] = val;
            }
        }

        bc->cardinality = bitset_container_compute_cardinality(bc);
        if (bc->cardinality != 0) {
            *loc = bc;
        }
        if (bc->cardinality == c->cardinality) {
            return;
        }
    }

    if (hic == NULL) {
        // Both hic and loc can't be NULL, so bc is never NULL here
        if (bc->cardinality == 0) {
            bitset_container_free(bc);
        }
        return;
    }

    if (bc == NULL || bc->cardinality != 0) {
        bc = bitset_container_create();
    }

    if (i == 0) {
        memcpy(bc->words, c->words + end, 8 * b);
    } else {
        for (uint32_t k = end; k < 1024; ++k) {
            val = c->words[k] << i;
            val |= c->words[k - 1] >> (64 - i);
            bc->words[k - end] = val;
        }
        bc->words[b] = c->words[1023] >> (64 - i);
    }

    bc->cardinality = bitset_container_compute_cardinality(bc);
    if (bc->cardinality == 0) {
        bitset_container_free(bc);
        return;
    }
    *hic = bc;
}